

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixEnv::NewRandomAccessFile
          (PosixEnv *this,string *filename,RandomAccessFile **result)

{
  int *piVar1;
  int iVar2;
  _func_int **pp_Var3;
  int __fd;
  void *pvVar4;
  undefined8 *puVar5;
  int iVar6;
  undefined8 *in_RCX;
  int *piVar7;
  long in_FS_OFFSET;
  uint64_t file_size;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = 0;
  __fd = open((char *)*result,0x80000);
  if (__fd < 0) {
    __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00d08ddf;
    PosixError((string *)this,(int)*result);
  }
  else {
    piVar7 = (int *)((long)&filename[8].field_2 + 8);
    LOCK();
    piVar1 = (int *)((long)&filename[8].field_2 + 8);
    iVar2 = *piVar1;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (iVar2 < 1) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
      puVar5 = (undefined8 *)operator_new(0x38);
      local_58 = &local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*result,
                 (long)&(*result)->_vptr_RandomAccessFile + (long)&result[1]->_vptr_RandomAccessFile
                );
      *puVar5 = &PTR__PosixRandomAccessFile_01397f60;
      LOCK();
      piVar7 = (int *)((long)&filename[8].field_2 + 0xc);
      iVar2 = *piVar7;
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      piVar7 = (int *)((long)&filename[8].field_2 + 0xc);
      iVar6 = __fd;
      if (iVar2 < 1) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
        iVar6 = -1;
      }
      *(bool *)(puVar5 + 1) = 0 < iVar2;
      *(int *)((long)puVar5 + 0xc) = iVar6;
      puVar5[2] = piVar7;
      puVar5[3] = puVar5 + 5;
      if (local_58 == &local_48) {
        puVar5[5] = CONCAT71(uStack_47,local_48);
        puVar5[6] = uStack_40;
      }
      else {
        puVar5[3] = local_58;
        puVar5[5] = CONCAT71(uStack_47,local_48);
      }
      puVar5[4] = local_50;
      local_50 = 0;
      local_48 = 0;
      local_58 = &local_48;
      if (iVar2 < 1) {
        if (iVar6 != -1) {
          __assert_fail("fd_ == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                        ,0xa0,
                        "leveldb::(anonymous namespace)::PosixRandomAccessFile::PosixRandomAccessFile(std::string, int, Limiter *)"
                       );
        }
        close(__fd);
        *in_RCX = puVar5;
        if (local_58 != &local_48) {
          operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
        }
      }
      else {
        *in_RCX = puVar5;
      }
      (this->super_Env)._vptr_Env = (_func_int **)0x0;
    }
    else {
      (**(code **)((filename->_M_dataplus)._M_p + 0x58))(this,filename,result,local_88 + 8);
      if ((this->super_Env)._vptr_Env == (_func_int **)0x0) {
        pvVar4 = mmap((void *)0x0,local_88._8_8_,1,1,__fd,0);
        if (pvVar4 == (void *)0xffffffffffffffff) {
          __errno_location();
          PosixError((string *)local_88,(int)*result);
          pp_Var3 = (this->super_Env)._vptr_Env;
          (this->super_Env)._vptr_Env = (_func_int **)local_88._0_8_;
          local_88._0_8_ = pp_Var3;
          if (pp_Var3 != (_func_int **)0x0) {
            operator_delete__(pp_Var3);
          }
        }
        else {
          puVar5 = (undefined8 *)operator_new(0x40);
          local_78._M_allocated_capacity = (size_type)&local_68;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_88 + 0x10),*result,
                     (long)&(*result)->_vptr_RandomAccessFile +
                     (long)&result[1]->_vptr_RandomAccessFile);
          *puVar5 = &PTR__PosixMmapReadableFile_01397fa8;
          puVar5[1] = pvVar4;
          puVar5[2] = local_88._8_8_;
          puVar5[3] = piVar7;
          puVar5[4] = puVar5 + 6;
          if ((undefined1 *)local_78._M_allocated_capacity == &local_68) {
            puVar5[6] = CONCAT71(uStack_67,local_68);
            puVar5[7] = uStack_60;
          }
          else {
            puVar5[4] = local_78._M_allocated_capacity;
            puVar5[6] = CONCAT71(uStack_67,local_68);
          }
          puVar5[5] = local_78._8_8_;
          local_78._8_8_ = 0;
          local_68 = 0;
          *in_RCX = puVar5;
          local_78._M_allocated_capacity = (size_type)&local_68;
        }
      }
      close(__fd);
      if ((this->super_Env)._vptr_Env != (_func_int **)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00d08ddf:
      __stack_chk_fail();
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status NewRandomAccessFile(const std::string& filename,
                             RandomAccessFile** result) override {
    *result = nullptr;
    int fd = ::open(filename.c_str(), O_RDONLY | kOpenBaseFlags);
    if (fd < 0) {
      return PosixError(filename, errno);
    }

    if (!mmap_limiter_.Acquire()) {
      *result = new PosixRandomAccessFile(filename, fd, &fd_limiter_);
      return Status::OK();
    }

    uint64_t file_size;
    Status status = GetFileSize(filename, &file_size);
    if (status.ok()) {
      void* mmap_base =
          ::mmap(/*addr=*/nullptr, file_size, PROT_READ, MAP_SHARED, fd, 0);
      if (mmap_base != MAP_FAILED) {
        *result = new PosixMmapReadableFile(filename,
                                            reinterpret_cast<char*>(mmap_base),
                                            file_size, &mmap_limiter_);
      } else {
        status = PosixError(filename, errno);
      }
    }
    ::close(fd);
    if (!status.ok()) {
      mmap_limiter_.Release();
    }
    return status;
  }